

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-dgram-too-big.c
# Opt level: O2

int run_test_udp_dgram_too_big(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_10030;
  uv_buf_t uStack_10028;
  sockaddr_in addr;
  char dgram [65536];
  
  memset(dgram,0x2a,0x10000);
  puVar2 = uv_default_loop();
  iVar1 = uv_udp_init(puVar2,&handle_);
  if (iVar1 == 0) {
    uStack_10028 = uv_buf_init(dgram,0x10000);
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
    if (iVar1 == 0) {
      iVar1 = uv_udp_send(&req_,&handle_,&uStack_10028,1,(sockaddr *)&addr,send_cb);
      if (iVar1 == 0) {
        if (close_cb_called == 0) {
          if (send_cb_called == 0) {
            puVar2 = uv_default_loop();
            uv_run(puVar2,UV_RUN_DEFAULT);
            if (send_cb_called == 1) {
              if (close_cb_called == 1) {
                puVar2 = uv_default_loop();
                uv_walk(puVar2,close_walk_cb,(void *)0x0);
                uv_run(puVar2,UV_RUN_DEFAULT);
                puVar2 = uv_default_loop();
                iVar1 = uv_loop_close(puVar2);
                if (iVar1 == 0) {
                  uv_library_shutdown();
                  return 0;
                }
                pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                uStack_10030 = 0x59;
              }
              else {
                pcVar3 = "close_cb_called == 1";
                uStack_10030 = 0x57;
              }
            }
            else {
              pcVar3 = "send_cb_called == 1";
              uStack_10030 = 0x56;
            }
          }
          else {
            pcVar3 = "send_cb_called == 0";
            uStack_10030 = 0x52;
          }
        }
        else {
          pcVar3 = "close_cb_called == 0";
          uStack_10030 = 0x51;
        }
      }
      else {
        pcVar3 = "r == 0";
        uStack_10030 = 0x4f;
      }
    }
    else {
      pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
      uStack_10030 = 0x47;
    }
  }
  else {
    pcVar3 = "r == 0";
    uStack_10030 = 0x44;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-dgram-too-big.c"
          ,uStack_10030,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(udp_dgram_too_big) {
  char dgram[65536]; /* 64K MTU is unlikely, even on localhost */
  struct sockaddr_in addr;
  uv_buf_t buf;
  int r;

  memset(dgram, 42, sizeof dgram); /* silence valgrind */

  r = uv_udp_init(uv_default_loop(), &handle_);
  ASSERT(r == 0);

  buf = uv_buf_init(dgram, sizeof dgram);
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_send(&req_,
                  &handle_,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(send_cb_called == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(send_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}